

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O0

_Bool extend_array(roaring_array_t *ra,int32_t k)

{
  int in_ESI;
  int *in_RDI;
  int32_t unaff_retaddr;
  int32_t new_capacity;
  int32_t max_containers;
  int32_t desired_size;
  _Bool local_1;
  
  if (in_RDI[1] < *in_RDI + in_ESI) {
    local_1 = realloc_array(_new_capacity,unaff_retaddr);
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool extend_array(roaring_array_t *ra, int32_t k) {
    int32_t desired_size = ra->size + k;
    const int32_t max_containers = 65536;
    assert(desired_size <= max_containers);
    if (desired_size > ra->allocation_size) {
        int32_t new_capacity =
            (ra->size < 1024) ? 2 * desired_size : 5 * desired_size / 4;
        if (new_capacity > max_containers) {
            new_capacity = max_containers;
        }

        return realloc_array(ra, new_capacity);
    }
    return true;
}